

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExecFPU_cpp.h
# Opt level: O0

bool __thiscall moira::Moira::isValidExtFPU(Moira *this,Instr I,Mode M,u16 op,u32 ext)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  u8 cmd;
  u8 lst;
  u8 fmt;
  u8 mode;
  u8 cod;
  u32 ext_local;
  u16 op_local;
  Mode M_local;
  Instr I_local;
  Moira *this_local;
  
  uVar5 = ext >> 0xd;
  bVar1 = (byte)uVar5 & 7;
  uVar6 = ext >> 0xb;
  bVar2 = (byte)uVar6 & 3;
  bVar3 = (byte)(ext >> 10) & 7;
  bVar4 = (byte)(ext >> 10) & 7;
  switch(I) {
  case FDBcc:
  case FScc:
  case FTRAPcc:
    return (ext & 0xffe0) == 0;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/dirkwhoffmann[P]Moira/Moira/MoiraExecFPU_cpp.h"
                  ,0x74,"bool moira::Moira::isValidExtFPU(Instr, Mode, u16, u32) const");
  case FMOVE:
    break;
  case FMOVEM:
    goto switchD_00135d3a_caseD_c1;
  case FMOVECR:
    return (op & 0x3f) == 0;
  }
  if ((uVar5 & 7) == 0) {
    if ((((ext & 0x7f) != 0) || ((uVar5 & 7) != 0)) || ((op & 0x3f) == 0)) {
      return true;
    }
  }
  else if (bVar1 == 2) {
    if (M != IP) {
      return true;
    }
  }
  else if ((((bVar1 == 3) && (((bVar3 == 3 || (bVar3 == 7)) || ((ext & 0x7f) == 0)))) &&
           ((M != DN || (((bVar3 != 2 && (bVar3 != 3)) && ((bVar3 != 5 && (bVar3 != 7)))))))) &&
          (((M != AN || ((bVar3 != 3 && (bVar3 != 7)))) &&
           ((M != DIPC &&
            ((((M != IXPC && (M != IM)) && (M != IP)) && ((bVar3 != 7 || ((ext & 0xf) == 0))))))))))
  {
    return true;
  }
switchD_00135d3a_caseD_c1:
  uVar5 = (uint)bVar1;
  if (uVar5 == 4) {
    if (((ext & 0x3ff) == 0) && (M != IP)) {
      return true;
    }
  }
  else if (uVar5 == 5) {
    if ((((ext & 0x3ff) == 0) &&
        ((((M != DN && (M != AN)) || ((ext >> 10 & 7) == 0)) ||
         (((bVar4 == 1 || (bVar4 == 2)) || (bVar4 == 4)))))) &&
       (((M != DIPC && (M != IXPC)) && ((M != IM && (M != IP)))))) {
      return true;
    }
  }
  else if ((((((uVar5 - 6 < 2) && ((ext & 0x700) == 0)) &&
             ((((bVar2 != 3 || ((ext & 0x8f) == 0)) && (((M != DN && (M != AN)) && (M != DIPC)))) &&
              ((((M != IXPC && (M != IM)) && (M != IP)) &&
               ((M != AI || (((uVar6 & 3) != 0 && (bVar2 != 1)))))))))) &&
            ((M != PI || ((((uVar6 & 3) != 0 && (bVar2 != 1)) && (bVar1 != 7)))))) &&
           ((M != PD ||
            ((bVar1 != 6 &&
             ((((bVar1 != 7 || (bVar2 != 1)) || ((ext & 0x8f) == 0)) &&
              ((bVar1 != 7 || ((bVar2 != 2 && (bVar2 != 3)))))))))))) &&
          (((M != DI && (((M != IX && (M != AW)) && (M != AL)))) ||
           (((uVar6 & 3) != 0 && (bVar2 != 1)))))) {
    return true;
  }
  return false;
}

Assistant:

bool
Moira::isValidExtFPU(Instr I, Mode M, u16 op, u32 ext) const
{
    auto cod  = xxx_____________ (ext);
    auto mode = ___xx___________ (ext);
    auto fmt  = ___xxx__________ (ext);
    auto lst  = ___xxx__________ (ext);
    auto cmd  = _________xxxxxxx (ext);

    switch (I) {

        case Instr::FDBcc:
        case Instr::FScc:
        case Instr::FTRAPcc:

            return (ext & 0xFFE0) == 0;

        case Instr::FMOVECR:

            return (op & 0x3F) == 0;

        case Instr::FMOVE:

            switch (cod) {

                case 0b010:

                    if (M == Mode::IP) break;
                    return true;

                case 0b000:

                    if (cmd == 0 && cod == 0 && (op & 0x3F)) break;
                    return true;

                case 0b011:

                    if (fmt != 0b011 && fmt != 0b111 && (ext & 0x7F)) break;

                    if (M == Mode::DN) {
                        if (fmt == 0b010 || fmt == 0b011 || fmt == 0b101 || fmt == 0b111) break;
                    }
                    if (M == Mode::AN) {
                        if (fmt == 0b011 || fmt == 0b111) break;
                    }
                    if (M == Mode::DIPC || M == Mode::IXPC || M == Mode::IM || M == Mode::IP) {
                        break;
                    } else {
                        if (fmt == 0b111 && (ext & 0xF)) break;
                    }

                    return true;
            }

        case Instr::FMOVEM:

            switch (cod) {

                case 0b101:
                {

                    if (ext & 0x3FF) break;

                    if (M == Mode::DN || M == Mode::AN) {
                        if (lst != 0b000 && lst != 0b001 && lst != 0b010 && lst != 0b100) break;
                    }
                    if (M == Mode::DIPC || M == Mode::IXPC || M == Mode::IM || M == Mode::IP) {
                        break;
                    }
                    return true;
                }
                case 0b100:

                    if (ext & 0x3FF) break;
                    if (M == Mode::IP) break;
                    return true;

                case 0b110:
                case 0b111:

                    if (ext & 0x0700) break;
                    if (mode == 3 && (ext & 0x8F)) break;

                    if (M == Mode::DN || M == Mode::AN) {
                        break;
                    }
                    if (M == Mode::DIPC || M == Mode::IXPC || M == Mode::IM || M == Mode::IP) {
                        break;
                    }
                    if (M == Mode::AI) {
                        if (mode == 0 || mode == 1) break;
                    }
                    if (M == Mode::PI) {
                        if (mode == 0 || mode == 1 || cod == 0b111) break;
                    }
                    if (M == Mode::PD) {
                        if (cod == 0b110) break;
                        if (cod == 0b111 && (mode == 1) && (ext & 0x8F)) break;
                        if (cod == 0b111 && (mode == 2 || mode == 3)) break;
                    }
                    if (M == Mode::DI || M == Mode::IX || M == Mode::AW || M == Mode::AL) {
                        if (mode == 0 || mode == 1) break;
                    }
                    return true;
            }
            return false;

        default:
            fatalError;
    }
}